

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O0

void __thiscall HttpResponse::HttpResponse(HttpResponse *this)

{
  initializer_list<std::pair<const_CharContent,_CharContent>_> __l;
  pair<const_CharContent,_CharContent> *local_cd0;
  allocator<std::pair<const_CharContent,_CharContent>_> local_cb7;
  key_equal local_cb6;
  hasher local_cb5 [13];
  pair<const_CharContent,_CharContent> *local_ca8;
  pair<const_CharContent,_CharContent> local_ca0;
  pair<const_CharContent,_CharContent> local_c50;
  pair<const_CharContent,_CharContent> local_c00;
  pair<const_CharContent,_CharContent> local_bb0;
  pair<const_CharContent,_CharContent> local_b60;
  pair<const_CharContent,_CharContent> local_b10;
  pair<const_CharContent,_CharContent> local_ac0;
  pair<const_CharContent,_CharContent> local_a70;
  pair<const_CharContent,_CharContent> local_a20;
  pair<const_CharContent,_CharContent> local_9d0;
  pair<const_CharContent,_CharContent> local_980;
  pair<const_CharContent,_CharContent> local_930;
  pair<const_CharContent,_CharContent> local_8e0;
  pair<const_CharContent,_CharContent> local_890;
  pair<const_CharContent,_CharContent> local_840;
  pair<const_CharContent,_CharContent> local_7f0;
  pair<const_CharContent,_CharContent> local_7a0;
  pair<const_CharContent,_CharContent> local_750;
  pair<const_CharContent,_CharContent> local_700;
  pair<const_CharContent,_CharContent> local_6b0;
  pair<const_CharContent,_CharContent> local_660;
  pair<const_CharContent,_CharContent> local_610;
  pair<const_CharContent,_CharContent> local_5c0;
  pair<const_CharContent,_CharContent> local_570;
  pair<const_CharContent,_CharContent> local_520;
  pair<const_CharContent,_CharContent> local_4d0;
  pair<const_CharContent,_CharContent> local_480;
  pair<const_CharContent,_CharContent> local_430;
  pair<const_CharContent,_CharContent> local_3e0;
  pair<const_CharContent,_CharContent> local_390;
  pair<const_CharContent,_CharContent> local_340;
  pair<const_CharContent,_CharContent> local_2f0;
  pair<const_CharContent,_CharContent> local_2a0;
  pair<const_CharContent,_CharContent> local_250;
  pair<const_CharContent,_CharContent> local_200;
  pair<const_CharContent,_CharContent> local_1b0;
  pair<const_CharContent,_CharContent> local_160;
  pair<const_CharContent,_CharContent> local_110;
  pair<const_CharContent,_CharContent> local_c0;
  pair<const_CharContent,_CharContent> local_70;
  iterator local_20;
  size_type local_18;
  HttpResponse *local_10;
  HttpResponse *this_local;
  
  this->_vptr_HttpResponse = (_func_int **)&PTR__HttpResponse_00132c78;
  local_ca8 = &local_ca0;
  local_10 = this;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[9],_true>
            (local_ca8,(char (*) [4])"100",(char (*) [9])"Continue");
  local_ca8 = &local_c50;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[20],_true>
            (local_ca8,(char (*) [4])"101",(char (*) [20])"Switching Protocols");
  local_ca8 = &local_c00;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (local_ca8,(char (*) [4])"200",(char (*) [3])"OK");
  local_ca8 = &local_bb0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[8],_true>
            (local_ca8,(char (*) [4])"201",(char (*) [8])"Created");
  local_ca8 = &local_b60;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[9],_true>
            (local_ca8,(char (*) [4])"202",(char (*) [9])"Accepted");
  local_ca8 = &local_b10;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[30],_true>
            (local_ca8,(char (*) [4])"203",(char (*) [30])"Non-Authoritative Information");
  local_ca8 = &local_ac0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[11],_true>
            (local_ca8,(char (*) [4])"204",(char (*) [11])"No Content");
  local_ca8 = &local_a70;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[14],_true>
            (local_ca8,(char (*) [4])"205",(char (*) [14])"Reset Content");
  local_ca8 = &local_a20;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (local_ca8,(char (*) [4])"206",(char (*) [16])"Partial Content");
  local_ca8 = &local_9d0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[17],_true>
            (local_ca8,(char (*) [4])"300",(char (*) [17])"Multiple Choices");
  local_ca8 = &local_980;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[18],_true>
            (local_ca8,(char (*) [4])"301",(char (*) [18])"Moved Permanently");
  local_ca8 = &local_930;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[6],_true>
            (local_ca8,(char (*) [4])"302",(char (*) [6])0x1293f0);
  local_ca8 = &local_8e0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[10],_true>
            (local_ca8,(char (*) [4])"303",(char (*) [10])"See Other");
  local_ca8 = &local_890;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[13],_true>
            (local_ca8,(char (*) [4])"304",(char (*) [13])"Not Modified");
  local_ca8 = &local_840;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[10],_true>
            (local_ca8,(char (*) [4])"305",(char (*) [10])"Use Proxy");
  local_ca8 = &local_7f0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[19],_true>
            (local_ca8,(char (*) [4])"307",(char (*) [19])"Temporary Redirect");
  local_ca8 = &local_7a0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[12],_true>
            (local_ca8,(char (*) [4])"400",(char (*) [12])"Bad Request");
  local_ca8 = &local_750;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[13],_true>
            (local_ca8,(char (*) [4])"401",(char (*) [13])"Unauthorized");
  local_ca8 = &local_700;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[17],_true>
            (local_ca8,(char (*) [4])"402",(char (*) [17])"Payment Required");
  local_ca8 = &local_6b0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[10],_true>
            (local_ca8,(char (*) [4])"403",(char (*) [10])"Forbidden");
  local_ca8 = &local_660;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[10],_true>
            (local_ca8,(char (*) [4])"404",(char (*) [10])"Not Found");
  local_ca8 = &local_610;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[19],_true>
            (local_ca8,(char (*) [4])"405",(char (*) [19])"Method Not Allowed");
  local_ca8 = &local_5c0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[15],_true>
            (local_ca8,(char (*) [4])"406",(char (*) [15])"Not Acceptable");
  local_ca8 = &local_570;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[30],_true>
            (local_ca8,(char (*) [4])"407",(char (*) [30])"Proxy Authentication Required");
  local_ca8 = &local_520;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (local_ca8,(char (*) [4])"408",(char (*) [16])"Request Timeout");
  local_ca8 = &local_4d0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[9],_true>
            (local_ca8,(char (*) [4])"409",(char (*) [9])"Conflict");
  local_ca8 = &local_480;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[5],_true>
            (local_ca8,(char (*) [4])"410",(char (*) [5])"Gone");
  local_ca8 = &local_430;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (local_ca8,(char (*) [4])"411",(char (*) [16])"Length Required");
  local_ca8 = &local_3e0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[20],_true>
            (local_ca8,(char (*) [4])"412",(char (*) [20])"Precondition Failed");
  local_ca8 = &local_390;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[25],_true>
            (local_ca8,(char (*) [4])"413",(char (*) [25])"Request Entity Too Large");
  local_ca8 = &local_340;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[21],_true>
            (local_ca8,(char (*) [4])"414",(char (*) [21])"Request-URI Too Long");
  local_ca8 = &local_2f0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[23],_true>
            (local_ca8,(char (*) [4])"415",(char (*) [23])"Unsupported Media Type");
  local_ca8 = &local_2a0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[32],_true>
            (local_ca8,(char (*) [4])"416",(char (*) [32])"Requested Range Not Satisfiable");
  local_ca8 = &local_250;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[19],_true>
            (local_ca8,(char (*) [4])"417",(char (*) [19])"Expectation Failed");
  local_ca8 = &local_200;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[22],_true>
            (local_ca8,(char (*) [4])"500",(char (*) [22])"Internal Server Error");
  local_ca8 = &local_1b0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (local_ca8,(char (*) [4])"501",(char (*) [16])"Not Implemented");
  local_ca8 = &local_160;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[12],_true>
            (local_ca8,(char (*) [4])"502",(char (*) [12])"Bad Gateway");
  local_ca8 = &local_110;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[20],_true>
            (local_ca8,(char (*) [4])"503",(char (*) [20])"Service Unavailable");
  local_ca8 = &local_c0;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (local_ca8,(char (*) [4])"504",(char (*) [16])"Gateway Timeout");
  local_ca8 = &local_70;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[27],_true>
            (local_ca8,(char (*) [4])"505",(char (*) [27])"HTTP Version Not Supported");
  local_20 = &local_ca0;
  local_18 = 0x28;
  std::allocator<std::pair<const_CharContent,_CharContent>_>::allocator(&local_cb7);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
  ::unordered_map(&this->response_code_map,__l,0,local_cb5,&local_cb6,&local_cb7);
  std::allocator<std::pair<const_CharContent,_CharContent>_>::~allocator(&local_cb7);
  local_cd0 = (pair<const_CharContent,_CharContent> *)&stack0xffffffffffffffe0;
  do {
    local_cd0 = local_cd0 + -1;
    std::pair<const_CharContent,_CharContent>::~pair(local_cd0);
  } while (local_cd0 != &local_ca0);
  return;
}

Assistant:

HttpResponse():response_code_map({//come from RFC2616
                                             //1xx
                                             {"100","Continue"},
                                             {"101","Switching Protocols"},
                                             //2xx
                                             {"200","OK"},
                                             {"201","Created"},
                                             {"202","Accepted"},
                                             {"203","Non-Authoritative Information"},
                                             {"204","No Content"},
                                             {"205","Reset Content"},
                                             {"206","Partial Content"},
                                             //3xx
                                             {"300","Multiple Choices"},
                                             {"301","Moved Permanently"},
                                             {"302","Found"},
                                             {"303","See Other"},
                                             {"304","Not Modified"},
                                             {"305","Use Proxy"},
                                             {"307","Temporary Redirect"},
                                             //4xx
                                             {"400","Bad Request"},
                                             {"401","Unauthorized"},
                                             {"402","Payment Required"},
                                             {"403","Forbidden"},
                                             {"404","Not Found"},
                                             {"405","Method Not Allowed"},
                                             {"406","Not Acceptable"},
                                             {"407","Proxy Authentication Required"},
                                             {"408","Request Timeout"},
                                             {"409","Conflict"},
                                             {"410","Gone"},
                                             {"411","Length Required"},
                                             {"412","Precondition Failed"},
                                             {"413","Request Entity Too Large"},
                                             {"414","Request-URI Too Long"},
                                             {"415","Unsupported Media Type"},
                                             {"416","Requested Range Not Satisfiable"},
                                             {"417","Expectation Failed"},
                                             //5xx
                                             {"500","Internal Server Error"},
                                             {"501","Not Implemented"},
                                             {"502","Bad Gateway"},
                                             {"503","Service Unavailable"},
                                             {"504","Gateway Timeout"},
                                             {"505","HTTP Version Not Supported"}
                                     }){}